

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 mpp_hevc_decode_short_term_rps
                 (HEVCContext *s,ShortTermRPS *rps,HEVCSPS *sps,RK_S32 is_slice_header)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  RK_U32 RVar5;
  MPP_RET MVar6;
  RK_S32 local_bc;
  RK_U32 local_b8;
  RK_S32 _out_11;
  RK_U32 _out_10;
  RK_S32 _out_9;
  RK_U32 _out_8;
  RK_U32 _out_7;
  RK_U32 _out_6;
  RK_U32 nb_positive_pics;
  RK_U32 prev;
  RK_S32 used_2;
  RK_S32 tmp;
  RK_S32 used_1;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 used;
  RK_U32 _out_3;
  RK_S32 _out_2;
  RK_U32 _out_1;
  RK_U32 delta_idx;
  RK_U8 delta_rps_sign;
  int iStack_6c;
  RK_U8 use_delta_flag;
  RK_S32 abs_delta_rps;
  RK_S32 delta_rps;
  ShortTermRPS *rps_ridx;
  BitReadCtx_t *pBStack_58;
  RK_S32 _out;
  BitReadCtx_t *gb;
  RK_U32 local_48;
  RK_S32 i;
  RK_S32 k;
  RK_S32 k0;
  RK_S32 delta_poc;
  RK_U8 rps_predict;
  HEVCLocalContext *lc;
  HEVCSPS *pHStack_28;
  RK_S32 is_slice_header_local;
  HEVCSPS *sps_local;
  ShortTermRPS *rps_local;
  HEVCContext *s_local;
  
  pBStack_58 = &s->HEVClc->gb;
  k0._3_1_ = '\0';
  i = 0;
  local_48 = 0;
  _delta_poc = pBStack_58;
  lc._4_4_ = is_slice_header;
  pHStack_28 = sps;
  sps_local = (HEVCSPS *)rps;
  rps_local = (ShortTermRPS *)s;
  if ((rps != sps->st_rps) && (sps->nb_st_rps != 0)) {
    MVar6 = mpp_read_bits(pBStack_58,1,(RK_S32 *)((long)&rps_ridx + 4));
    pBStack_58->ret = MVar6;
    if (pBStack_58->ret != MPP_OK) {
      return -0x3ec;
    }
    k0._3_1_ = rps_ridx._4_1_;
  }
  if (k0._3_1_ == '\0') {
    MVar6 = mpp_read_ue(pBStack_58,&_out_8);
    pBStack_58->ret = MVar6;
    if (pBStack_58->ret == MPP_OK) {
      sps_local->vps_id = _out_8;
      MVar6 = mpp_read_ue(pBStack_58,(RK_U32 *)&_out_9);
      pBStack_58->ret = MVar6;
      if (pBStack_58->ret == MPP_OK) {
        _out_7 = _out_9;
        if ((sps_local->vps_id < 0x10) && ((uint)_out_9 < 0x10)) {
          sps_local->sps_id = sps_local->vps_id + _out_9;
          if (sps_local->sps_id == 0) {
            return 0;
          }
          _out_6 = 0;
          gb._4_4_ = 0;
          while( true ) {
            if (sps_local->vps_id <= gb._4_4_) {
              _out_6 = 0;
              gb._4_4_ = 0;
              while( true ) {
                if (_out_7 <= gb._4_4_) {
                  return 0;
                }
                MVar6 = mpp_read_ue(pBStack_58,&local_b8);
                pBStack_58->ret = MVar6;
                if (pBStack_58->ret != MPP_OK) break;
                k = local_b8 + 1;
                _out_6 = k + _out_6;
                *(RK_U32 *)
                 ((long)(sps_local->temporal_layer + -6) + (ulong)(sps_local->vps_id + gb._4_4_) * 4
                 ) = _out_6;
                MVar6 = mpp_read_bits(pBStack_58,1,&local_bc);
                pBStack_58->ret = MVar6;
                if (pBStack_58->ret != MPP_OK) {
                  return -0x3ec;
                }
                *(char *)((long)&sps_local->temporal_layer[4].max_latency_increase +
                         (ulong)(sps_local->vps_id + gb._4_4_)) = (char)local_bc;
                gb._4_4_ = gb._4_4_ + 1;
              }
              return -0x3ec;
            }
            MVar6 = mpp_read_ue(pBStack_58,&_out_10);
            pBStack_58->ret = MVar6;
            if (pBStack_58->ret != MPP_OK) {
              return -0x3ec;
            }
            k = _out_10 + 1;
            _out_6 = _out_6 - k;
            *(RK_U32 *)((long)(sps_local->temporal_layer + -6) + (long)(int)gb._4_4_ * 4) = _out_6;
            MVar6 = mpp_read_bits(pBStack_58,1,&_out_11);
            pBStack_58->ret = MVar6;
            if (pBStack_58->ret != MPP_OK) break;
            *(char *)((long)&sps_local->temporal_layer[4].max_latency_increase + (long)(int)gb._4_4_
                     ) = (char)_out_11;
            gb._4_4_ = gb._4_4_ + 1;
          }
          return -0x3ec;
        }
        _mpp_log_l(2,"H265PARSER_PS","Too many refs in a short term RPS.\n",(char *)0x0);
        return -0x3ec;
      }
    }
  }
  else {
    _out_1._3_1_ = '\0';
    if (lc._4_4_ == 0) {
      _abs_delta_rps =
           (ShortTermRPS *)
           ((long)(pHStack_28->scaling_list).sl[3] +
           (((long)sps_local - (long)pHStack_28->st_rps) / 0xac) * 0xac + 0xe7);
    }
    else {
      _out_2 = 0;
      MVar6 = mpp_read_ue(pBStack_58,&_out_3);
      pBStack_58->ret = MVar6;
      if (pBStack_58->ret != MPP_OK) {
        return -0x3ec;
      }
      _out_2 = _out_3 + 1;
      if (pHStack_28->nb_st_rps < (uint)_out_2) {
        _mpp_log_l(2,"H265PARSER_PS","Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                   (char *)0x0,(ulong)(uint)_out_2,(ulong)pHStack_28->nb_st_rps);
        return -0x3ec;
      }
      _abs_delta_rps = pHStack_28->st_rps + (pHStack_28->nb_st_rps - _out_2);
    }
    MVar6 = mpp_read_bits(pBStack_58,1,&used);
    pBStack_58->ret = MVar6;
    if (pBStack_58->ret == MPP_OK) {
      _out_1._2_1_ = (byte)used;
      MVar6 = mpp_read_ue(pBStack_58,(RK_U32 *)&_out_4);
      pBStack_58->ret = MVar6;
      if (pBStack_58->ret == MPP_OK) {
        delta_idx = _out_4 + 1;
        iStack_6c = ((uint)_out_1._2_1_ * -2 + 1) * delta_idx;
        gb._4_4_ = 0;
        while( true ) {
          if (_abs_delta_rps->num_delta_pocs < (int)gb._4_4_) {
            sps_local->sps_id = local_48;
            sps_local->vps_id = i;
            if (sps_local->sps_id != 0) {
              for (gb._4_4_ = 1; (int)gb._4_4_ < (int)sps_local->sps_id; gb._4_4_ = gb._4_4_ + 1) {
                iVar2 = *(int *)((long)(sps_local->temporal_layer + -6) + (long)(int)gb._4_4_ * 4);
                uVar1 = *(undefined1 *)
                         ((long)&sps_local->temporal_layer[4].max_latency_increase +
                         (long)(int)gb._4_4_);
                RVar5 = gb._4_4_;
                while (iVar4 = RVar5, local_48 = iVar4 + -1, -1 < (int)local_48) {
                  RVar5 = local_48;
                  if (iVar2 < *(int *)((long)(sps_local->temporal_layer + -6) +
                                      (long)(int)local_48 * 4)) {
                    *(int *)((long)(sps_local->temporal_layer + -6) + (long)iVar4 * 4) =
                         *(int *)((long)(sps_local->temporal_layer + -6) + (long)(int)local_48 * 4);
                    *(undefined1 *)
                     ((long)&sps_local->temporal_layer[4].max_latency_increase + (long)iVar4) =
                         *(undefined1 *)
                          ((long)&sps_local->temporal_layer[4].max_latency_increase +
                          (long)(int)local_48);
                    *(int *)((long)(sps_local->temporal_layer + -6) + (long)(int)local_48 * 4) =
                         iVar2;
                    *(undefined1 *)
                     ((long)&sps_local->temporal_layer[4].max_latency_increase + (long)(int)local_48
                     ) = uVar1;
                    RVar5 = local_48;
                  }
                }
              }
            }
            if (sps_local->vps_id >> 1 != 0) {
              local_48 = sps_local->vps_id;
              for (gb._4_4_ = 0; local_48 = local_48 - 1, gb._4_4_ < sps_local->vps_id >> 1;
                  gb._4_4_ = gb._4_4_ + 1) {
                uVar3 = *(undefined4 *)
                         ((long)(sps_local->temporal_layer + -6) + (long)(int)gb._4_4_ * 4);
                uVar1 = *(undefined1 *)
                         ((long)&sps_local->temporal_layer[4].max_latency_increase +
                         (long)(int)gb._4_4_);
                *(undefined4 *)((long)(sps_local->temporal_layer + -6) + (long)(int)gb._4_4_ * 4) =
                     *(undefined4 *)
                      ((long)(sps_local->temporal_layer + -6) + (long)(int)local_48 * 4);
                *(undefined1 *)
                 ((long)&sps_local->temporal_layer[4].max_latency_increase + (long)(int)gb._4_4_) =
                     *(undefined1 *)
                      ((long)&sps_local->temporal_layer[4].max_latency_increase +
                      (long)(int)local_48);
                *(undefined4 *)((long)(sps_local->temporal_layer + -6) + (long)(int)local_48 * 4) =
                     uVar3;
                *(undefined1 *)
                 ((long)&sps_local->temporal_layer[4].max_latency_increase + (long)(int)local_48) =
                     uVar1;
              }
            }
            return 0;
          }
          _out_5 = 0;
          MVar6 = mpp_read_bits(pBStack_58,1,&used_1);
          pBStack_58->ret = MVar6;
          if (pBStack_58->ret != MPP_OK) break;
          _out_5 = used_1;
          *(char *)((long)&sps_local->temporal_layer[4].max_latency_increase + (long)(int)local_48)
               = (char)used_1;
          if (used_1 == 0) {
            MVar6 = mpp_read_bits(pBStack_58,1,&tmp);
            pBStack_58->ret = MVar6;
            if (pBStack_58->ret != MPP_OK) {
              return -0x3ec;
            }
            _out_1._3_1_ = (char)tmp;
          }
          if ((_out_5 != 0) || (_out_1._3_1_ != '\0')) {
            if ((int)gb._4_4_ < _abs_delta_rps->num_delta_pocs) {
              k = iStack_6c + _abs_delta_rps->delta_poc[(int)gb._4_4_];
            }
            else {
              k = iStack_6c;
            }
            *(RK_S32 *)((long)(sps_local->temporal_layer + -6) + (long)(int)local_48 * 4) = k;
            if (k < 0) {
              i = i + 1;
            }
            local_48 = local_48 + 1;
          }
          gb._4_4_ = gb._4_4_ + 1;
        }
        return -0x3ec;
      }
    }
  }
  return -0x3ec;
}

Assistant:

int mpp_hevc_decode_short_term_rps(HEVCContext *s, ShortTermRPS *rps,
                                   const HEVCSPS *sps, RK_S32 is_slice_header)
{
    HEVCLocalContext *lc = s->HEVClc;
    RK_U8 rps_predict = 0;
    RK_S32 delta_poc;
    RK_S32 k0 = 0;
    RK_S32 k  = 0;
    RK_S32 i;

    BitReadCtx_t *gb = &lc->gb;

    if (rps != sps->st_rps && sps->nb_st_rps)
        READ_ONEBIT(gb, &rps_predict);

    if (rps_predict) {
        const ShortTermRPS *rps_ridx;
        RK_S32 delta_rps, abs_delta_rps;
        RK_U8 use_delta_flag = 0;
        RK_U8 delta_rps_sign;

        if (is_slice_header) {
            RK_U32 delta_idx = 0;
            READ_UE(gb, &delta_idx);
            delta_idx = delta_idx + 1;
            if (delta_idx > sps->nb_st_rps) {
                mpp_err(
                    "Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                    delta_idx, sps->nb_st_rps);
                return  MPP_ERR_STREAM;
            }
            rps_ridx = &sps->st_rps[sps->nb_st_rps - delta_idx];
        } else
            rps_ridx = &sps->st_rps[rps - sps->st_rps - 1];

        READ_BITS(gb, 1, &delta_rps_sign);

        READ_UE(gb, &abs_delta_rps);

        abs_delta_rps = abs_delta_rps + 1;

        delta_rps      = (1 - (delta_rps_sign << 1)) * abs_delta_rps;
        for (i = 0; i <= rps_ridx->num_delta_pocs; i++) {
            RK_S32 used = 0;
            READ_ONEBIT(gb, &used);

            rps->used[k] = used;

            if (!used)
                READ_ONEBIT(gb, &use_delta_flag);

            if (used || use_delta_flag) {
                if (i < rps_ridx->num_delta_pocs)
                    delta_poc = delta_rps + rps_ridx->delta_poc[i];
                else
                    delta_poc = delta_rps;
                rps->delta_poc[k] = delta_poc;
                if (delta_poc < 0)
                    k0++;
                k++;
            }
        }

        rps->num_delta_pocs    = k;
        rps->num_negative_pics = k0;
        // sort in increasing order (smallest first)
        if (rps->num_delta_pocs != 0) {
            RK_S32 used, tmp;
            for (i = 1; i < rps->num_delta_pocs; i++) {
                delta_poc = rps->delta_poc[i];
                used      = rps->used[i];
                for (k = i - 1; k >= 0; k--) {
                    tmp = rps->delta_poc[k];
                    if (delta_poc < tmp) {
                        rps->delta_poc[k + 1] = tmp;
                        rps->used[k + 1]      = rps->used[k];
                        rps->delta_poc[k]     = delta_poc;
                        rps->used[k]          = used;
                    }
                }
            }
        }
        if ((rps->num_negative_pics >> 1) != 0) {
            RK_S32 used;
            k = rps->num_negative_pics - 1;
            // flip the negative values to largest first
            for (i = 0; (RK_U32)i < rps->num_negative_pics >> 1; i++) {
                delta_poc         = rps->delta_poc[i];
                used              = rps->used[i];
                rps->delta_poc[i] = rps->delta_poc[k];
                rps->used[i]      = rps->used[k];
                rps->delta_poc[k] = delta_poc;
                rps->used[k]      = used;
                k--;
            }
        }
    } else {
        RK_U32 prev, nb_positive_pics;

        READ_UE(gb, &rps->num_negative_pics);

        READ_UE(gb, &nb_positive_pics);

        if (rps->num_negative_pics >= MAX_REFS ||
            nb_positive_pics >= MAX_REFS) {
            mpp_err( "Too many refs in a short term RPS.\n");
            return  MPP_ERR_STREAM;
        }

        rps->num_delta_pocs = rps->num_negative_pics + nb_positive_pics;
        if (rps->num_delta_pocs) {
            prev = 0;
            for (i = 0; (RK_U32)i < rps->num_negative_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc += 1;
                prev -= delta_poc;
                rps->delta_poc[i] = prev;
                READ_ONEBIT(gb, &rps->used[i]);
            }
            prev = 0;
            for (i = 0; (RK_U32)i < nb_positive_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc = delta_poc + 1;
                prev += delta_poc;
                rps->delta_poc[rps->num_negative_pics + i] = prev;
                READ_ONEBIT(gb, &rps->used[rps->num_negative_pics + i]);
            }
        }
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}